

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipcdial.c
# Opt level: O0

int nni_ipc_dialer_alloc(nng_stream_dialer **dp,nng_url *url)

{
  int iVar1;
  nng_stream_dialer *ptr;
  size_t sVar2;
  size_t sVar3;
  size_t len;
  ipc_dialer *d;
  nng_url *url_local;
  nng_stream_dialer **dp_local;
  
  ptr = (nng_stream_dialer *)nni_zalloc(0x130);
  if (ptr == (nng_stream_dialer *)0x0) {
    return 2;
  }
  iVar1 = strcmp(url->u_scheme,"ipc");
  if ((iVar1 == 0) || (iVar1 = strcmp(url->u_scheme,"unix"), iVar1 == 0)) {
    if ((url->u_path == (char *)0x0) ||
       ((sVar2 = strlen(url->u_path), sVar2 == 0 || (0x80 < sVar2)))) {
      nni_free(ptr,0x130);
      return 0xf;
    }
    *(undefined2 *)&ptr[2].sd_close = 2;
    nni_strlcpy((char *)((long)&ptr[2].sd_close + 2),url->u_path,0x80);
  }
  else {
    iVar1 = strcmp(url->u_scheme,"abstract");
    if (iVar1 != 0) {
      nni_free(ptr,0x130);
      return 0xf;
    }
    sVar3 = nni_url_decode((uint8_t *)((long)&ptr[2].sd_close + 4),url->u_path,0x6b);
    if (sVar3 == 0xffffffffffffffff) {
      nni_free(ptr,0x130);
      return 0xf;
    }
    *(undefined2 *)&ptr[2].sd_close = 5;
    *(short *)((long)&ptr[2].sd_close + 2) = (short)sVar3;
  }
  nni_mtx_init((nni_mtx *)&ptr[1].sd_get);
  nni_aio_list_init((nni_list *)(ptr + 1));
  *(undefined1 *)&ptr[1].sd_dial = 0;
  ptr->sd_free = ipc_dialer_free;
  ptr->sd_close = ipc_dialer_close;
  ptr->sd_stop = ipc_dialer_stop;
  ptr->sd_dial = ipc_dialer_dial;
  ptr->sd_get = ipc_dialer_get;
  ptr->sd_set = ipc_dialer_set;
  nni_refcnt_init((nni_refcnt *)&ptr[4].sd_stop,1,ptr,ipc_dialer_fini);
  *dp = ptr;
  return 0;
}

Assistant:

int
nni_ipc_dialer_alloc(nng_stream_dialer **dp, const nng_url *url)
{
	ipc_dialer *d;
	size_t      len;

	if ((d = NNI_ALLOC_STRUCT(d)) == NULL) {
		return (NNG_ENOMEM);
	}

	if ((strcmp(url->u_scheme, "ipc") == 0) ||
	    (strcmp(url->u_scheme, "unix") == 0)) {
		if ((url->u_path == NULL) ||
		    ((len = strlen(url->u_path)) == 0) ||
		    (len > NNG_MAXADDRLEN)) {
			NNI_FREE_STRUCT(d);
			return (NNG_EADDRINVAL);
		}
		d->sa.s_ipc.sa_family = NNG_AF_IPC;
		nni_strlcpy(d->sa.s_ipc.sa_path, url->u_path, NNG_MAXADDRLEN);

#ifdef NNG_HAVE_ABSTRACT_SOCKETS
	} else if (strcmp(url->u_scheme, "abstract") == 0) {

		// path is url encoded.
		len = nni_url_decode(d->sa.s_abstract.sa_name, url->u_path,
		    sizeof(d->sa.s_abstract.sa_name));
		if (len == (size_t) -1) {
			NNI_FREE_STRUCT(d);
			return (NNG_EADDRINVAL);
		}

		d->sa.s_abstract.sa_family = NNG_AF_ABSTRACT;
		d->sa.s_abstract.sa_len    = len;
#endif

	} else {
		NNI_FREE_STRUCT(d);
		return (NNG_EADDRINVAL);
	}

	nni_mtx_init(&d->mtx);
	nni_aio_list_init(&d->connq);
	d->closed      = false;
	d->sd.sd_free  = ipc_dialer_free;
	d->sd.sd_close = ipc_dialer_close;
	d->sd.sd_stop  = ipc_dialer_stop;
	d->sd.sd_dial  = ipc_dialer_dial;
	d->sd.sd_get   = ipc_dialer_get;
	d->sd.sd_set   = ipc_dialer_set;
	nni_refcnt_init(&d->ref, 1, d, ipc_dialer_fini);

	*dp = (void *) d;
	return (0);
}